

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O0

Quaternion * __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::computeQuaternion_
          (Quaternion *__return_storage_ptr__,StableIMUFixedContactDynamicalSystem *this,Vector3 *x)

{
  bool bVar1;
  AngleAxis local_40;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_20;
  Vector3 *x_local;
  StableIMUFixedContactDynamicalSystem *this_local;
  
  local_20 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x;
  x_local = (Vector3 *)this;
  this_local = (StableIMUFixedContactDynamicalSystem *)__return_storage_ptr__;
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,2,3,1>>::operator!=
                    ((MatrixBase<Eigen::Matrix<double,3,1,2,3,1>> *)&this->orientationVector_,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x);
  if (bVar1) {
    Eigen::Matrix<double,3,1,2,3,1>::operator=
              ((Matrix<double,3,1,2,3,1> *)&this->orientationVector_,local_20);
    kine::rotationVectorToAngleAxis(&local_40,(Vector3 *)local_20);
    Eigen::QuaternionBase<Eigen::Quaternion<double,_2>_>::operator=
              ((QuaternionBase<Eigen::Quaternion<double,_2>_> *)&this->quaternion_,&local_40);
  }
  Eigen::Quaternion<double,0>::Quaternion<Eigen::Quaternion<double,2>>
            ((Quaternion<double,0> *)__return_storage_ptr__,
             (QuaternionBase<Eigen::Quaternion<double,_2>_> *)&this->quaternion_);
  return __return_storage_ptr__;
}

Assistant:

Quaternion StableIMUFixedContactDynamicalSystem::computeQuaternion_(const Vector3 & x)
{
  if(orientationVector_ != x)
  {
    orientationVector_ = x;
    quaternion_ = kine::rotationVectorToAngleAxis(x);
  }

  return quaternion_;
}